

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

void __thiscall BasicBlock::AddSucc(BasicBlock *this,FlowEdge *edge,FlowGraph *graph)

{
  FlowGraph *graph_local;
  FlowEdge *edge_local;
  BasicBlock *this_local;
  
  graph_local = (FlowGraph *)edge;
  edge_local = (FlowEdge *)this;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Prepend
            (&(this->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>,
             &graph->alloc->super_ArenaAllocator,(FlowEdge **)&graph_local);
  return;
}

Assistant:

void
BasicBlock::AddSucc(FlowEdge * edge, FlowGraph * graph)
{
    this->succList.Prepend(graph->alloc, edge);
}